

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lddgraph.hxx
# Opt level: O2

bool __thiscall lddgraph::removefile(lddgraph *this,string *file)

{
  int iVar1;
  ostream *poVar2;
  
  iVar1 = remove((file->_M_dataplus)._M_p);
  if ((iVar1 != 0) && (this->_quiet == false)) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Error: Unable to delete file ");
    poVar2 = std::operator<<(poVar2,(string *)file);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  return iVar1 == 0;
}

Assistant:

bool removefile(const string & file)
    {
      if (remove(file.c_str()) != 0)
      {
        if (!_quiet)
          cerr << "Error: Unable to delete file " << file << endl;
        return false;
      }
      return true;
    }